

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O3

Sexp * __thiscall GcHeap::GcHeapImpl::Allocate(GcHeapImpl *this,bool should_finalize)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  Sexp *pSVar3;
  Sexp *pSVar4;
  
  SignalContractViolation(NoGc,"Allocate");
  pSVar4 = (Sexp *)this->free;
  pSVar3 = pSVar4 + 1;
  if (((Sexp *)this->top < pSVar3) || (this->stress == true)) {
    DebugLog("bump pointer alloc failed, triggering a GC");
    Collect(this);
    pSVar4 = (Sexp *)this->free;
    pSVar3 = pSVar4 + 1;
    if ((Sexp *)this->top < pSVar3) {
      PanicImpl("/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                ,200,"Allocate","out of memory!");
    }
  }
  DebugLog("allocated object at %p, new bump at %p",pSVar4,pSVar3);
  this->free = (uint8_t *)pSVar3;
  (pSVar4->field_1).cons.cdr = (Sexp *)0x0;
  pSVar4->padding = 0;
  *(undefined8 *)pSVar4 = 0;
  (pSVar4->field_1).cons.car = (Sexp *)0x0;
  if (should_finalize) {
    DebugLog("marking object %p for finalization",pSVar4);
    p_Var2 = (_List_node_base *)operator_new(0x18);
    p_Var2[1]._M_next = (_List_node_base *)pSVar4;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    psVar1 = &(this->finalize_queue).super__List_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return pSVar4;
}

Assistant:

Sexp *Allocate(bool should_finalize) {
    // on a debug build, this triggers a stackwalk which will assert if
    // any of the calling functions has a FORBID_GC contract.
    CONTRACT_VIOLATIONS { PERFORMS_GC; }